

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalIndexManager.hpp
# Opt level: O2

void __thiscall
OpenMD::IndexListContainer::IndexListContainer(IndexListContainer *this,int minIndex,int maxIndex)

{
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  value_type local_18;
  
  this->maxIndex_ = maxIndex;
  this_00 = &this->indexContainer_;
  (this->indexContainer_).
  super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->indexContainer_).
  super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->indexContainer_).
  super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl._M_node.
  _M_size = 0;
  local_18.second = maxIndex;
  local_18.first = minIndex;
  std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
            (this_00,&local_18);
  return;
}

Assistant:

IndexListContainer(int minIndex = 0, int maxIndex = MAX_INTEGER) :
        maxIndex_(maxIndex) {
      indexContainer_.push_back(std::make_pair(minIndex, maxIndex));
    }